

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merl.cpp
# Opt level: O3

bool loadNpfTexture(void)

{
  GLboolean GVar1;
  GLenum GVar2;
  FILE *__stream;
  bool bVar3;
  vector<float,_std::allocator<float>_> data;
  
  fwrite("Loading {NPF-Texture}\n",0x16,1,_stdout);
  fflush(_stdout);
  __stream = fopen(g_sphere.shading.pathToUberData,"rb");
  data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (__stream == (FILE *)0x0) {
    bVar3 = false;
  }
  else {
    std::vector<float,_std::allocator<float>_>::resize(&data,0x60000);
    fread(data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start,4,
          (long)data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start >> 2,__stream);
    fclose(__stream);
    GVar1 = (*glad_glIsTexture)(g_gl.textures[4]);
    if (GVar1 != '\0') {
      (*glad_glDeleteTextures)(1,g_gl.textures + 4);
    }
    (*glad_glGenTextures)(1,g_gl.textures + 4);
    (*glad_glActiveTexture)(0x84c4);
    (*glad_glBindTexture)(0xde1,g_gl.textures[4]);
    (*glad_glTexStorage2D)(0xde1,1,0x8815,0x200,0x100);
    (*glad_glTexSubImage2D)
              (0xde1,0,0,0,0x200,0x100,0x1907,0x1406,
               data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
    (*glad_glTexParameteri)(0xde1,0x2801,0x2600);
    (*glad_glTexParameteri)(0xde1,0x2800,0x2600);
    (*glad_glTexParameteri)(0xde1,0x2802,0x812f);
    (*glad_glTexParameteri)(0xde1,0x2803,0x812f);
    (*glad_glActiveTexture)(0x84c0);
    GVar2 = (*glad_glGetError)();
    bVar3 = GVar2 == 0;
    if (data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return bVar3;
}

Assistant:

bool loadNpfTexture()
{
    LOG("Loading {NPF-Texture}\n");
    FILE *pf = fopen(g_sphere.shading.pathToUberData, "rb");
    std::vector<float> data;

    if (!pf)
        return false;
    data.resize(512 * 256 * 3);
    fread(&data[0], sizeof(float), data.size(), pf);
    fclose(pf);
    if (glIsTexture(g_gl.textures[TEXTURE_NPF]))
        glDeleteTextures(1, &g_gl.textures[TEXTURE_NPF]);
    glGenTextures(1, &g_gl.textures[TEXTURE_NPF]);

    glActiveTexture(GL_TEXTURE0 + TEXTURE_NPF);
    glBindTexture(GL_TEXTURE_2D, g_gl.textures[TEXTURE_NPF]);
    glTexStorage2D(GL_TEXTURE_2D,
                   1,
                   GL_RGB32F,
                   512,
                   256);
    glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, 512, 256, GL_RGB, GL_FLOAT, &data[0]);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);

    glActiveTexture(GL_TEXTURE0);

    return (glGetError() == GL_NO_ERROR);
}